

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

void __thiscall lest::unexpected::~unexpected(unexpected *this)

{
  pointer pcVar1;
  
  *(undefined ***)&this->super_message = &PTR__message_00244ba8;
  pcVar1 = (this->super_message).note.info._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_message).note.info.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->super_message).where.file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_message).where.file.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->super_message).kind._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_message).kind.field_2) {
    operator_delete(pcVar1);
  }
  std::runtime_error::~runtime_error((runtime_error *)this);
  operator_delete(this);
  return;
}

Assistant:

unexpected( location where_, text expr_, text note_ = "" )
    : message( "failed: got unexpected exception", where_, expr_, note_) {}